

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O0

void __thiscall
CVmObjStrCompMapReaderStream::read_mapping
          (CVmObjStrCompMapReaderStream *this,wchar_t *ref_ch,unsigned_long *uc_result_flags,
          unsigned_long *lc_result_flags,wchar_t *val_buf,size_t *value_ch_cnt)

{
  ulong uVar1;
  byte bVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  ulong *in_R9;
  size_t i;
  size_t copy_size;
  size_t copy_limit;
  ulong local_48;
  ulong local_40;
  undefined4 *local_28;
  
  uVar1 = *in_R9;
  uVar3 = (**(code **)(**(long **)(in_RDI + 8) + 0x30))();
  *in_RSI = uVar3;
  bVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x18))();
  local_40 = (ulong)bVar2;
  *in_R9 = local_40;
  uVar4 = (**(code **)(**(long **)(in_RDI + 8) + 0x40))();
  *in_RDX = uVar4;
  uVar4 = (**(code **)(**(long **)(in_RDI + 8) + 0x40))();
  *in_RCX = uVar4;
  if (uVar1 < local_40) {
    local_40 = uVar1;
  }
  local_28 = in_R8;
  for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
    uVar3 = (**(code **)(**(long **)(in_RDI + 8) + 0x30))();
    *local_28 = uVar3;
    local_28 = local_28 + 1;
  }
  for (; local_48 < *in_R9; local_48 = local_48 + 1) {
    (**(code **)(**(long **)(in_RDI + 8) + 0x30))();
  }
  return;
}

Assistant:

virtual void read_mapping(VMG_ wchar_t *ref_ch,
                              unsigned long *uc_result_flags,
                              unsigned long *lc_result_flags,
                              wchar_t *val_buf, size_t *value_ch_cnt)
    {
        size_t copy_limit;
        size_t copy_size;
        size_t i;

        /* limit our value character copying to the actual buffer size */
        copy_limit = *value_ch_cnt;
        
        /* read the header values */
        *ref_ch = (wchar_t)str_->read_uint2();
        copy_size = *value_ch_cnt = str_->read_byte();
        *uc_result_flags = str_->read_uint4();
        *lc_result_flags = str_->read_uint4();

        /* limit copying to the actual buffer size */
        if (copy_size > copy_limit)
            copy_size = copy_limit;

        /* read the values */
        for (i = 0 ; i < copy_size ; ++i)
            *val_buf++ = (wchar_t)str_->read_uint2();

        /* skip any values from the input that we weren't able to store */
        for ( ; i < *value_ch_cnt ; ++i)
            str_->read_uint2();
    }